

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O3

int __thiscall
CVmObjTads::getp_create_multi_common
          (CVmObjTads *this,vm_obj_id_t self,vm_val_t *retval,uint *in_argc,int is_transient)

{
  int iVar1;
  vm_obj_id_t vVar2;
  uint argc;
  
  if (in_argc == (uint *)0x0) {
    argc = 0;
  }
  else {
    argc = *in_argc;
  }
  if (getp_create_multi_common(unsigned_int,vm_val_t*,unsigned_int*,int)::desc == '\0') {
    getp_create_multi_common();
  }
  iVar1 = CVmObject::get_prop_check_argc(retval,in_argc,&getp_create_multi_common::desc);
  if (iVar1 == 0) {
    vVar2 = create_from_stack_multi(argc,is_transient);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar2;
  }
  return 1;
}

Assistant:

int CVmObjTads::getp_create_multi_common(VMG_ vm_obj_id_t self,
                                         vm_val_t *retval, uint *in_argc,
                                         int is_transient)
{
    uint argc = (in_argc != 0 ? *in_argc : 0);
    static CVmNativeCodeDesc desc(0, 0, TRUE);

    /* check arguments - any number are allowed */
    if (get_prop_check_argc(retval, in_argc, &desc))
        return TRUE;

    /* create the new instance */
    retval->set_obj(create_from_stack_multi(vmg_ argc, is_transient));

    /* handled */
    return TRUE;
}